

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_floor.cpp
# Opt level: O2

bool EV_StartWaggle(int tag,line_t_conflict *line,int height,int speed,int offset,int timer,
                   bool ceiling)

{
  bool bVar1;
  uint uVar2;
  DCeilingWaggle *this;
  long lVar3;
  sector_t_conflict *sec;
  bool bVar4;
  FSectorTagIterator itr;
  
  FSectorTagIterator::FSectorTagIterator(&itr,tag,line);
  bVar4 = false;
LAB_00403e16:
  do {
    uVar2 = FSectorTagIterator::Next(&itr);
    if ((int)uVar2 < 0) {
      return bVar4;
    }
    sec = sectors + uVar2;
    if (!ceiling) goto LAB_00403e66;
    bVar1 = sector_t::PlaneMoving((sector_t *)sec,1);
  } while (bVar1);
  this = (DCeilingWaggle *)DObject::operator_new(0x80);
  lVar3 = 0xf0;
  DCeilingWaggle::DCeilingWaggle(this,sec);
  goto LAB_00403e8e;
LAB_00403e66:
  bVar1 = sector_t::PlaneMoving((sector_t *)sec,0);
  if (!bVar1) {
    this = (DCeilingWaggle *)DObject::operator_new(0x80);
    lVar3 = 200;
    DFloorWaggle::DFloorWaggle((DFloorWaggle *)this,sec);
LAB_00403e8e:
    (this->super_DWaggleBase).m_OriginalDist =
         *(double *)((long)&sec->planes[0].xform.xOffs + lVar3);
    (this->super_DWaggleBase).m_Accumulator = (double)offset;
    (this->super_DWaggleBase).m_Scale = 0.0;
    (this->super_DWaggleBase).m_AccDelta = (double)speed * 0.015625;
    (this->super_DWaggleBase).m_TargetScale = (double)height * 0.015625;
    (this->super_DWaggleBase).m_ScaleDelta =
         ((double)height * 0.015625) / (double)((height * 0x69) / 0xff + 0x23);
    (this->super_DWaggleBase).m_Ticker = -(uint)(timer == 0) | timer * 0x23;
    (this->super_DWaggleBase).m_State = 1;
    bVar4 = true;
  }
  goto LAB_00403e16;
}

Assistant:

bool EV_StartWaggle (int tag, line_t *line, int height, int speed, int offset,
	int timer, bool ceiling)
{
	int sectorIndex;
	sector_t *sector;
	DWaggleBase *waggle;
	bool retCode;

	retCode = false;

	FSectorTagIterator itr(tag, line);

	while ((sectorIndex = itr.Next()) >= 0)
	{
		sector = &sectors[sectorIndex];
		if ((!ceiling && sector->PlaneMoving(sector_t::floor)) || 
			(ceiling && sector->PlaneMoving(sector_t::ceiling)))
		{ // Already busy with another thinker
			continue;
		}
		retCode = true;
		if (ceiling)
		{
			waggle = new DCeilingWaggle (sector);
			waggle->m_OriginalDist = sector->ceilingplane.fD();
		}
		else
		{
			waggle = new DFloorWaggle (sector);
			waggle->m_OriginalDist = sector->floorplane.fD();
		}
		waggle->m_Accumulator = offset;
		waggle->m_AccDelta = speed / 64.;
		waggle->m_Scale = 0;
		waggle->m_TargetScale = height / 64.;
		waggle->m_ScaleDelta = waggle->m_TargetScale / (TICRATE + ((3 * TICRATE)*height) / 255);
		waggle->m_Ticker = timer ? timer*TICRATE : -1;
		waggle->m_State = WGLSTATE_EXPAND;
	}
	return retCode;
}